

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<duckdb::uhugeint_t,false,false>
          (uhugeint_t min_value,uhugeint_t max_value)

{
  bool bVar1;
  uhugeint_t *in_RDX;
  uhugeint_t value;
  bitpacking_width_t bitwidth;
  uhugeint_t *in_stack_ffffffffffffffa8;
  uhugeint_t *in_stack_ffffffffffffffb0;
  uhugeint_t *in_stack_ffffffffffffffb8;
  bitpacking_width_t local_29;
  bitpacking_width_t local_1;
  
  uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffffb0,0);
  bVar1 = uhugeint_t::operator==(in_RDX,in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_1 = '\0';
  }
  else {
    local_29 = '\0';
    while( true ) {
      bVar1 = uhugeint_t::operator_cast_to_bool(in_stack_ffffffffffffffb0);
      if (!bVar1) break;
      local_29 = local_29 + '\x01';
      uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffffa0,1);
      uhugeint_t::operator>>=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    local_1 = GetEffectiveWidth<duckdb::uhugeint_t>(local_29);
  }
  return local_1;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}